

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O2

int nettlp_init(nettlp *nt)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  ushort uVar4;
  
  if (nt->dir == DMA_ISSUED_BY_ADAPTER) {
    bVar1 = nt->tag & 0xf;
    uVar4 = 0x4000;
  }
  else {
    if (nt->dir != DMA_ISSUED_BY_LIBTLP) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      return -1;
    }
    bVar1 = nt->tag;
    uVar4 = 0x3000;
  }
  uVar4 = uVar4 | bVar1;
  nt->port = uVar4;
  iVar2 = nettlp_create_udp_socket
                    ((in_addr)(nt->remote_addr).s_addr,uVar4,(in_addr)(nt->local_addr).s_addr,uVar4)
  ;
  if (-1 < iVar2) {
    nt->sockfd = iVar2;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int nettlp_init(struct nettlp *nt)
{
	int fd;

	switch (nt->dir) {
	case DMA_ISSUED_BY_LIBTLP:
		nt->port = NETTLP_LIBTLP_PORT_BASE + nt->tag;
		break;
	case DMA_ISSUED_BY_ADAPTER:
		nt->port = NETTLP_ADAPTER_PORT_BASE + (nt->tag & 0x0F);
		break;
	default:
		errno = EINVAL;
		return -1;
	}

	fd = nettlp_create_udp_socket(nt->remote_addr, nt->port,
				      nt->local_addr, nt->port);
	if (fd < 0)
		return fd;

	nt->sockfd = fd;

	return 0;
}